

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_dict_vputl(hd_context *ctx,pdf_obj *obj,pdf_obj *val,__va_list_tag *keys)

{
  uint uVar1;
  pdf_document *doc_00;
  pdf_obj *ppVar2;
  char *pcVar3;
  pdf_obj *ppVar4;
  long *local_98;
  long *local_80;
  long *local_68;
  pdf_document *doc;
  pdf_obj *next_obj;
  pdf_obj *next_key;
  pdf_obj *key;
  __va_list_tag *keys_local;
  pdf_obj *val_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  val_local = obj;
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    val_local = pdf_resolve_indirect_chain(ctx,obj);
  }
  if (((pdf_obj *)0x188 < val_local) && (val_local->kind == 'd')) {
    doc_00 = *(pdf_document **)(val_local + 2);
    uVar1 = keys->gp_offset;
    if (uVar1 < 0x29) {
      local_68 = (long *)((long)(int)uVar1 + (long)keys->reg_save_area);
      keys->gp_offset = uVar1 + 8;
    }
    else {
      local_68 = (long *)keys->overflow_arg_area;
      keys->overflow_arg_area = local_68 + 1;
    }
    ppVar2 = (pdf_obj *)*local_68;
    ppVar4 = val_local;
    if ((pdf_obj *)*local_68 != (pdf_obj *)0x0) {
      do {
        val_local = ppVar4;
        next_key = ppVar2;
        uVar1 = keys->gp_offset;
        if (uVar1 < 0x29) {
          local_80 = (long *)((long)(int)uVar1 + (long)keys->reg_save_area);
          keys->gp_offset = uVar1 + 8;
        }
        else {
          local_80 = (long *)keys->overflow_arg_area;
          keys->overflow_arg_area = local_80 + 1;
        }
        ppVar2 = (pdf_obj *)*local_80;
        if (ppVar2 == (pdf_obj *)0x0) {
          pdf_dict_put(ctx,val_local,next_key,val);
          return;
        }
        ppVar4 = pdf_dict_get(ctx,val_local,next_key);
      } while (ppVar4 != (pdf_obj *)0x0);
      do {
        next_obj = ppVar2;
        ppVar4 = pdf_new_dict(ctx,doc_00,1);
        pdf_dict_put_drop(ctx,val_local,next_key,ppVar4);
        next_key = next_obj;
        uVar1 = keys->gp_offset;
        if (uVar1 < 0x29) {
          local_98 = (long *)((long)(int)uVar1 + (long)keys->reg_save_area);
          keys->gp_offset = uVar1 + 8;
        }
        else {
          local_98 = (long *)keys->overflow_arg_area;
          keys->overflow_arg_area = local_98 + 1;
        }
        ppVar2 = (pdf_obj *)*local_98;
        val_local = ppVar4;
      } while ((pdf_obj *)*local_98 != (pdf_obj *)0x0);
      pdf_dict_put(ctx,ppVar4,next_obj,val);
    }
    return;
  }
  pcVar3 = pdf_objkindstr(val_local);
  hd_throw(ctx,2,"not a dict (%s)",pcVar3);
}

Assistant:

static void
pdf_dict_vputl(hd_context *ctx, pdf_obj *obj, pdf_obj *val, va_list keys)
{
    pdf_obj *key;
    pdf_obj *next_key;
    pdf_obj *next_obj;
    pdf_document *doc;

    RESOLVE(obj);
    if (!OBJ_IS_DICT(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not a dict (%s)", pdf_objkindstr(obj));

    doc = DICT(obj)->doc;

    key = va_arg(keys, pdf_obj *);
    if (key == NULL)
        return;

    while ((next_key = va_arg(keys, pdf_obj *)) != NULL)
    {
        next_obj = pdf_dict_get(ctx, obj, key);
        if (next_obj == NULL)
            goto new_obj;
        obj = next_obj;
        key = next_key;
    }

    pdf_dict_put(ctx, obj, key, val);
    return;

    new_obj:
    /* We have to create entries */
    do
    {
        next_obj = pdf_new_dict(ctx, doc, 1);
        pdf_dict_put_drop(ctx, obj, key, next_obj);
        obj = next_obj;
        key = next_key;
    }
    while ((next_key = va_arg(keys, pdf_obj *)) != NULL);

    pdf_dict_put(ctx, obj, key, val);
    return;
}